

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O2

char * getSegments(char ch)

{
  int iVar1;
  undefined7 in_register_00000039;
  ulong uStack_8;
  
  iVar1 = (int)CONCAT71(in_register_00000039,ch);
  if ((byte)(ch - 0x30U) < 10) {
    uStack_8 = (ulong)(iVar1 - 0x30);
    goto LAB_003e902c;
  }
  if ((byte)(ch + 0xbfU) < 6) {
    uStack_8 = (ulong)(iVar1 - 0x35);
    goto LAB_003e902c;
  }
  if ((byte)(ch + 0x9fU) < 6) {
    uStack_8 = (ulong)(iVar1 - 0x55);
    goto LAB_003e902c;
  }
  iVar1 = (int)ch;
  switch(iVar1) {
  case 0x67:
    uStack_8 = 9;
    break;
  case 0x68:
    uStack_8 = 0x12;
    break;
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x71:
  case 0x74:
  case 0x76:
  case 0x77:
  case 0x78:
    goto switchD_003e8fc1_caseD_49;
  case 0x6c:
switchD_003e8fc1_caseD_4c:
    uStack_8 = 0x14;
    break;
  case 0x6f:
    uStack_8 = 0x15;
    break;
  case 0x70:
switchD_003e8fc1_caseD_50:
    uStack_8 = 0x16;
    break;
  case 0x72:
switchD_003e8fc1_caseD_52:
    uStack_8 = 0x17;
    break;
  case 0x73:
switchD_003e8fc1_caseD_53:
    uStack_8 = 5;
    break;
  case 0x75:
    uStack_8 = 0x18;
    break;
  case 0x79:
switchD_003e8fc1_caseD_59:
    uStack_8 = 0x1a;
    break;
  default:
    switch(iVar1) {
    case 0x48:
      uStack_8 = 0x13;
      break;
    case 0x4c:
      goto switchD_003e8fc1_caseD_4c;
    case 0x4f:
      uStack_8 = 0;
      break;
    case 0x50:
      goto switchD_003e8fc1_caseD_50;
    case 0x52:
      goto switchD_003e8fc1_caseD_52;
    case 0x53:
      goto switchD_003e8fc1_caseD_53;
    case 0x55:
      uStack_8 = 0x19;
      break;
    case 0x59:
      goto switchD_003e8fc1_caseD_59;
    default:
      if (iVar1 == 0x27) {
        uStack_8 = 0x1c;
        break;
      }
      if (iVar1 == 0x2d) {
        uStack_8 = 10;
        break;
      }
      if (iVar1 == 0x2e) {
        uStack_8 = 0xb;
        break;
      }
      if (iVar1 == 0x3a) {
        uStack_8 = 0x1b;
        break;
      }
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4d:
    case 0x4e:
    case 0x51:
    case 0x54:
    case 0x56:
    case 0x57:
    case 0x58:
switchD_003e8fc1_caseD_49:
      uStack_8 = 0x1d;
    }
  }
LAB_003e902c:
  return getSegments::segments[uStack_8];
}

Assistant:

static const char *getSegments(char ch)               // gets list of segments for ch
{
    static const char segments[30][8] =
       { { 0, 1, 2, 4, 5, 6,99, 0},             // 0    0 / O
         { 2, 5,99, 0, 0, 0, 0, 0},             // 1    1
         { 0, 2, 3, 4, 6,99, 0, 0},             // 2    2
         { 0, 2, 3, 5, 6,99, 0, 0},             // 3    3
         { 1, 2, 3, 5,99, 0, 0, 0},             // 4    4
         { 0, 1, 3, 5, 6,99, 0, 0},             // 5    5 / S
         { 0, 1, 3, 4, 5, 6,99, 0},             // 6    6
         { 0, 2, 5,99, 0, 0, 0, 0},             // 7    7
         { 0, 1, 2, 3, 4, 5, 6,99},             // 8    8
         { 0, 1, 2, 3, 5, 6,99, 0},             // 9    9 / g
         { 3,99, 0, 0, 0, 0, 0, 0},             // 10   -
         { 7,99, 0, 0, 0, 0, 0, 0},             // 11   .
         { 0, 1, 2, 3, 4, 5,99, 0},             // 12   A
         { 1, 3, 4, 5, 6,99, 0, 0},             // 13   B
         { 0, 1, 4, 6,99, 0, 0, 0},             // 14   C
         { 2, 3, 4, 5, 6,99, 0, 0},             // 15   D
         { 0, 1, 3, 4, 6,99, 0, 0},             // 16   E
         { 0, 1, 3, 4,99, 0, 0, 0},             // 17   F
         { 1, 3, 4, 5,99, 0, 0, 0},             // 18   h
         { 1, 2, 3, 4, 5,99, 0, 0},             // 19   H
         { 1, 4, 6,99, 0, 0, 0, 0},             // 20   L
         { 3, 4, 5, 6,99, 0, 0, 0},             // 21   o
         { 0, 1, 2, 3, 4,99, 0, 0},             // 22   P
         { 3, 4,99, 0, 0, 0, 0, 0},             // 23   r
         { 4, 5, 6,99, 0, 0, 0, 0},             // 24   u
         { 1, 2, 4, 5, 6,99, 0, 0},             // 25   U
         { 1, 2, 3, 5, 6,99, 0, 0},             // 26   Y
         { 8, 9,99, 0, 0, 0, 0, 0},             // 27   :
         { 0, 1, 2, 3,99, 0, 0, 0},             // 28   '
         {99, 0, 0, 0, 0, 0, 0, 0} };           // 29   empty

    if (ch >= '0' && ch <= '9')
        return segments[ch - '0'];
    if (ch >= 'A' && ch <= 'F')
        return segments[ch - 'A' + 12];
    if (ch >= 'a' && ch <= 'f')
        return segments[ch - 'a' + 12];

    int n;
    switch (ch) {
        case '-':
            n = 10;  break;
        case 'O':
            n = 0;   break;
        case 'g':
            n = 9;   break;
        case '.':
            n = 11;  break;
        case 'h':
            n = 18;  break;
        case 'H':
            n = 19;  break;
        case 'l':
        case 'L':
            n = 20;  break;
        case 'o':
            n = 21;  break;
        case 'p':
        case 'P':
            n = 22;  break;
        case 'r':
        case 'R':
            n = 23;  break;
        case 's':
        case 'S':
            n = 5;   break;
        case 'u':
            n = 24;  break;
        case 'U':
            n = 25;  break;
        case 'y':
        case 'Y':
            n = 26;  break;
        case ':':
            n = 27;  break;
        case '\'':
            n = 28;  break;
        default:
            n = 29;  break;
    }
    return segments[n];
}